

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

double * __thiscall yy::mylanguage_parser::value_type::as<double>(value_type *this)

{
  bool bVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O2/parser.hpp"
                  ,0x140,"const T &yy::mylanguage_parser::value_type::as() const [T = double]");
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&double::typeinfo);
  if (bVar1) {
    return (double *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O2/parser.hpp"
                ,0x141,"const T &yy::mylanguage_parser::value_type::as() const [T = double]");
}

Assistant:

const T&
    as () const YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }